

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *centre,float radius,ImU32 col,int num_segments,float thickness)

{
  int *piVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *__dest;
  uint uVar5;
  ulong uVar6;
  
  if (0xffffff < col) {
    PathArcTo(this,centre,radius + -0.5,0.0,
              (((float)num_segments + -1.0) * 6.2831855) / (float)num_segments,num_segments);
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness,true);
    pIVar4 = GImGui;
    iVar2 = (this->_Path).Capacity;
    if (iVar2 < 0) {
      uVar5 = iVar2 / 2 + iVar2;
      uVar6 = 0;
      if (0 < (int)uVar5) {
        uVar6 = (ulong)uVar5;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)(uVar6 * 8);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->_Path).Size << 3);
      }
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_Path).Data = __dest;
      (this->_Path).Capacity = (int)uVar6;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& centre, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col >> 24) == 0)
        return;

    const float a_max = IM_PI*2.0f * ((float)num_segments - 1.0f) / (float)num_segments;
    PathArcTo(centre, radius-0.5f, 0.0f, a_max, num_segments);
    PathStroke(col, true, thickness);
}